

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

void divsufsortxx::substring::
     sort<char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
               (char *T,iterator PA,iterator first,iterator last,iterator buf,value_type bufsize,
               value_type depth,value_type size,bool lastsuffix,int blocksize)

{
  bool bVar1;
  iterator p2;
  iterator p1;
  bool bVar2;
  long lVar3;
  difference_type dVar4;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_R9;
  iterator iVar5;
  iterator iVar6;
  reference rVar7;
  BitmapArray<long> *in_stack_00000008;
  value_reference *in_stack_00000010;
  BitmapArray<long> *in_stack_00000028;
  BitmapArray<long> *in_stack_00000030;
  byte in_stack_00000038;
  int in_stack_00000040;
  char *in_stack_000003d8;
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
  *in_stack_000003e0;
  iterator in_stack_000003e8;
  iterator in_stack_000003f8;
  pos_type curbufsize;
  pos_type k;
  pos_type j;
  pos_type i;
  iterator curbuf;
  iterator b;
  iterator a;
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
  stack2;
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
  stack1;
  char *in_stack_00000600;
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
  *in_stack_00000608;
  iterator in_stack_00000610;
  iterator in_stack_00000620;
  iterator in_stack_00000640;
  iterator in_stack_00000650;
  iterator in_stack_00000660;
  value_type in_stack_00000670;
  value_type in_stack_00000678;
  BitmapArray<long> *in_stack_fffffffffffffab8;
  BitmapArray<long> *pBVar8;
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
  *in_stack_fffffffffffffac0;
  pos_type pVar9;
  pos_type pVar10;
  value_reference *this;
  BitmapArray<long> *in_stack_fffffffffffffac8;
  BitmapArray<long> *this_00;
  pos_type in_stack_fffffffffffffb38;
  BitmapArray<long> *in_stack_fffffffffffffb40;
  pos_type in_stack_fffffffffffffb48;
  BitmapArray<long> *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  int in_stack_fffffffffffffb5c;
  iterator local_188;
  iterator local_178;
  iterator local_168;
  BitmapArray<long> *local_158;
  value_reference *pvStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  difference_type local_138;
  long local_130;
  ulong local_128;
  ulong local_120;
  iterator local_118;
  iterator local_108;
  iterator local_f8 [12];
  byte local_31;
  long local_30;
  iterator local_20;
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_31 = in_stack_00000038 & 1;
  local_30 = in_R9;
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  std::
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>>
  ::
  stack<std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>,void>
            ((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
              *)in_stack_fffffffffffffac0);
  std::
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>
  ::
  stack<std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>,void>
            (in_stack_fffffffffffffac0);
  bitmap::BitmapArray<long>::iterator::iterator(local_f8);
  bitmap::BitmapArray<long>::iterator::iterator(&local_108);
  bitmap::BitmapArray<long>::iterator::iterator(&local_118);
  if ((local_31 & 1) != 0) {
    bitmap::BitmapArray<long>::iterator::operator++(&local_20);
  }
  bitmap::BitmapArray<long>::iterator::operator=(local_f8,&local_20);
  iVar5.pos_ = (pos_type)in_stack_fffffffffffffac0;
  iVar5.array_ = in_stack_fffffffffffffab8;
  local_120 = 0;
  while( true ) {
    pVar9 = iVar5.pos_;
    lVar3 = (long)in_stack_00000040;
    dVar4 = bitmap::BitmapArray<long>::iterator::operator-((iterator *)&stack0x00000008,local_f8);
    if (dVar4 <= lVar3) break;
    local_148 = local_10;
    uStack_140 = uStack_8;
    local_158 = local_f8[0].array_;
    pvStack_150 = (value_reference *)local_f8[0].pos_;
    iVar5 = bitmap::BitmapArray<long>::iterator::operator+
                      ((iterator *)in_stack_fffffffffffffac8,pVar9);
    in_stack_fffffffffffffac8 = in_stack_00000028;
    local_168 = iVar5;
    mintrosort<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>>,char*,bitmap::BitmapArray<long>::iterator>
              (in_stack_000003e0,in_stack_000003d8,in_stack_000003f8,in_stack_000003e8,_j,
               (value_type)curbuf.array_);
    iVar6 = bitmap::BitmapArray<long>::iterator::operator+
                      ((iterator *)in_stack_fffffffffffffac8,iVar5.pos_);
    local_178 = iVar6;
    bitmap::BitmapArray<long>::iterator::operator=(&local_118,&local_178);
    iVar6 = bitmap::BitmapArray<long>::iterator::operator+
                      ((iterator *)in_stack_fffffffffffffac8,iVar5.pos_);
    local_188 = iVar6;
    local_138 = bitmap::BitmapArray<long>::iterator::operator-
                          ((iterator *)&stack0x00000008,&local_188);
    if (local_138 < local_30) {
      bitmap::BitmapArray<long>::iterator::operator=(&local_108,local_f8);
      local_130 = (long)in_stack_00000040;
      for (local_128 = local_120; pVar9 = iVar5.pos_, (local_128 & 1) != 0;
          local_128 = (long)local_128 >> 1) {
        bitmap::BitmapArray<long>::iterator::operator-((iterator *)in_stack_fffffffffffffac8,pVar9);
        pVar10 = local_108.pos_;
        pBVar8 = local_108.array_;
        iVar5 = bitmap::BitmapArray<long>::iterator::operator+
                          ((iterator *)in_stack_fffffffffffffac8,pVar9);
        in_stack_fffffffffffffac8 = iVar5.array_;
        merge<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  (in_stack_00000608,in_stack_00000600,in_stack_00000620,in_stack_00000610,
                   in_stack_00000640,in_stack_00000650,in_stack_00000660,in_stack_00000670,
                   in_stack_00000678);
        bitmap::BitmapArray<long>::iterator::operator-=(&local_108,local_130);
        iVar5.pos_ = pVar10;
        iVar5.array_ = pBVar8;
        local_130 = local_130 << 1;
      }
    }
    else {
      bitmap::BitmapArray<long>::iterator::operator=(&local_108,local_f8);
      local_130 = (long)in_stack_00000040;
      for (local_128 = local_120; pVar9 = iVar5.pos_, (local_128 & 1) != 0;
          local_128 = (long)local_128 >> 1) {
        bitmap::BitmapArray<long>::iterator::operator-((iterator *)in_stack_fffffffffffffac8,pVar9);
        pVar10 = local_108.pos_;
        pBVar8 = local_108.array_;
        iVar5 = bitmap::BitmapArray<long>::iterator::operator+
                          ((iterator *)in_stack_fffffffffffffac8,pVar9);
        in_stack_fffffffffffffac8 = iVar5.array_;
        merge<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  (in_stack_00000608,in_stack_00000600,in_stack_00000620,in_stack_00000610,
                   in_stack_00000640,in_stack_00000650,in_stack_00000660,in_stack_00000670,
                   in_stack_00000678);
        bitmap::BitmapArray<long>::iterator::operator-=(&local_108,local_130);
        iVar5.pos_ = pVar10;
        iVar5.array_ = pBVar8;
        local_130 = local_130 << 1;
      }
    }
    bitmap::BitmapArray<long>::iterator::operator+=(local_f8,(long)in_stack_00000040);
    local_120 = local_120 + 1;
  }
  pBVar8 = in_stack_00000008;
  mintrosort<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long,int>>>>,char*,bitmap::BitmapArray<long>::iterator>
            (in_stack_000003e0,in_stack_000003d8,in_stack_000003f8,in_stack_000003e8,_j,
             (value_type)curbuf.array_);
  local_130 = (long)in_stack_00000040;
  this = in_stack_00000010;
  this_00 = in_stack_00000028;
  for (; local_120 != 0; local_120 = (long)local_120 >> 1) {
    if ((local_120 & 1) != 0) {
      bitmap::BitmapArray<long>::iterator::operator-((iterator *)this_00,(difference_type)this);
      pBVar8 = local_f8[0].array_;
      this = (value_reference *)local_f8[0].pos_;
      this_00 = in_stack_00000008;
      merge<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,char*,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                (in_stack_00000608,in_stack_00000600,in_stack_00000620,in_stack_00000610,
                 in_stack_00000640,in_stack_00000650,in_stack_00000660,in_stack_00000670,
                 in_stack_00000678);
      bitmap::BitmapArray<long>::iterator::operator-=(local_f8,local_130);
    }
    local_130 = local_130 << 1;
  }
  if ((local_31 & 1) != 0) {
    bitmap::BitmapArray<long>::iterator::operator=(local_f8,&local_20);
    bitmap::BitmapArray<long>::iterator::operator-((iterator *)this_00,(difference_type)this);
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x111f9c);
    local_120 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x111fdb);
    rVar7.pos_ = in_stack_fffffffffffffb48;
    rVar7.array_ = in_stack_fffffffffffffb50;
    iVar6.pos_ = in_stack_fffffffffffffb38;
    iVar6.array_ = in_stack_fffffffffffffb40;
    while( true ) {
      bVar2 = bitmap::BitmapArray<long>::iterator::operator<(local_f8,(iterator *)&stack0x00000008);
      bVar1 = false;
      if (bVar2) {
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11203a);
        lVar3 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                          ((value_reference *)0x112079);
        bVar1 = true;
        if (-1 < lVar3) {
          bitmap::BitmapArray<long>::iterator::operator+((iterator *)this_00,(difference_type)this);
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x112102);
          lVar3 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x112141);
          iVar5 = bitmap::BitmapArray<long>::iterator::operator+
                            ((iterator *)this_00,(difference_type)this);
          p1.array_._4_4_ = in_stack_fffffffffffffb5c;
          p1.array_._0_4_ = in_stack_fffffffffffffb58;
          p1.pos_ = iVar5.pos_;
          p2.pos_ = (pos_type)rVar7.array_;
          p2.array_ = (BitmapArray<long> *)rVar7.pos_;
          pBVar8 = in_stack_00000030;
          in_stack_fffffffffffffb5c =
               compare_last<char*,bitmap::BitmapArray<long>::iterator>
                         ((char *)iVar6.array_,p1,p2,iVar6.pos_,lVar3);
          bVar1 = 0 < in_stack_fffffffffffffb5c;
        }
      }
      if (!bVar1) break;
      rVar7 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11221e);
      iVar6 = bitmap::BitmapArray<long>::iterator::operator-
                        ((iterator *)this_00,(difference_type)this);
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1122a1);
      bitmap::BitmapArray<long>::value_reference::operator=(this,(value_reference *)pBVar8);
      bitmap::BitmapArray<long>::iterator::operator++(local_f8);
    }
    bitmap::BitmapArray<long>::iterator::operator-((iterator *)this_00,(difference_type)this);
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x112346);
    bitmap::BitmapArray<long>::value_reference::operator=(this,(long)pBVar8);
  }
  std::
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
  ::~stack((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
            *)0x11238f);
  std::
  stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
  ::~stack((stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_long,_int>_>_>_>
            *)0x11239c);
  return;
}

Assistant:

void sort(const StringIterator_type T, const SAIterator_type PA,
          SAIterator_type first, SAIterator_type last, BufIterator_type buf,
          typename std::iterator_traits<SAIterator_type>::value_type bufsize,
          typename std::iterator_traits<SAIterator_type>::value_type depth,
          typename std::iterator_traits<SAIterator_type>::value_type size,
          bool lastsuffix, int blocksize = 1024) {
  typedef typename std::iterator_traits<SAIterator_type>::value_type pos_type;
  std::stack<helper::stackinfo4<SAIterator_type, SAIterator_type, pos_type, int> > stack1;
  std::stack<
      helper::stackinfo4<SAIterator_type, SAIterator_type, SAIterator_type, int> > stack2;

  SAIterator_type a, b;
  SAIterator_type curbuf;
  pos_type i, j, k, curbufsize;

  if (lastsuffix != false) {
    ++first;
  }
  for (a = first, i = 0; blocksize < (last - a); a += blocksize, ++i) {
    mintrosort(stack1, T, PA, a, a + blocksize, depth);
    curbuf = a + blocksize;
    curbufsize = last - (a + blocksize);
    if (bufsize <= curbufsize) {
      for (b = a, k = blocksize, j = i; j & 1; b -= k, k <<= 1, j >>= 1) {
        merge(stack2, T, PA, b - k, b, b + k, curbuf, curbufsize, depth);
      }
    } else {
      for (b = a, k = blocksize, j = i; j & 1; b -= k, k <<= 1, j >>= 1) {
        merge(stack2, T, PA, b - k, b, b + k, buf, bufsize, depth);
      }
    }
  }
  mintrosort(stack1, T, PA, a, last, depth);
  for (k = blocksize; i != 0; k <<= 1, i >>= 1) {
    if (i & 1) {
      merge(stack2, T, PA, a - k, a, last, buf, bufsize, depth);
      a -= k;
    }
  }

  if (lastsuffix != false) {
    /* Insert last type B* suffix. */
    for (a = first, i = *(first - 1);
        (a < last)
            && ((*a < 0) || (0 < compare_last(T, PA + i, PA + *a, depth, size)));
        ++a) {
      *(a - 1) = *a;
    }
    *(a - 1) = i;
  }
}